

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.c
# Opt level: O3

void destroy_request(IceTCommRequest request)

{
  MPI_Request poVar1;
  
  poVar1 = getMPIRequest(request);
  if (poVar1 != (MPI_Request)&ompi_request_null) {
    icetRaiseDiagnostic("Destroying MPI request that is not NULL. Probably leaking MPI requests.",
                        0xffffffff,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                        ,0x9b);
  }
  free(request->internals);
  free(request);
  return;
}

Assistant:

static void destroy_request(IceTCommRequest request)
{
    MPI_Request mpi_request = getMPIRequest(request);
    if (mpi_request != MPI_REQUEST_NULL) {
        icetRaiseError("Destroying MPI request that is not NULL."
                       " Probably leaking MPI requests.",
                       ICET_SANITY_CHECK_FAIL);
    }

    free(request->internals);
    free(request);
}